

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O2

void __thiscall CGV::visit(CGV *this,CompareOp *node)

{
  CodeWriter *pCVar1;
  bool bVar2;
  ASTNode *this_00;
  string *psVar3;
  allocator local_bc;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string compareNodeSymbol;
  
  visitNodesAndUpdateFramePointer(this,&node->super_ASTNode,false);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&compareNodeSymbol,"r1",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_78);
  CodeWriter::loadWord(pCVar1,&compareNodeSymbol,-4,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&compareNodeSymbol);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&compareNodeSymbol,"r2",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_78);
  CodeWriter::loadWord(pCVar1,&compareNodeSymbol,-0xc,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&compareNodeSymbol);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&compareNodeSymbol,"Comparing",(allocator *)&local_b8);
  CodeWriter::comment(pCVar1,&compareNodeSymbol);
  std::__cxx11::string::~string((string *)&compareNodeSymbol);
  this_00 = AST::ASTNode::getChild(&node->super_ASTNode,1);
  psVar3 = AST::ASTNode::getName_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&compareNodeSymbol,(string *)psVar3);
  bVar2 = std::operator==(&compareNodeSymbol,"==");
  if (bVar2) {
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_b8,"ceq",&local_b9);
    std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
    std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
    CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
  }
  else {
    bVar2 = std::operator==(&compareNodeSymbol,"<>");
    if (bVar2) {
      pCVar1 = this->writer;
      std::__cxx11::string::string((string *)&local_b8,"cne",&local_b9);
      std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
      std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
      std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
      CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
    }
    else {
      bVar2 = std::operator==(&compareNodeSymbol,"<=");
      if (bVar2) {
        pCVar1 = this->writer;
        std::__cxx11::string::string((string *)&local_b8,"cle",&local_b9);
        std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
        std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
        std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
        CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
      }
      else {
        bVar2 = std::operator==(&compareNodeSymbol,">=");
        if (bVar2) {
          pCVar1 = this->writer;
          std::__cxx11::string::string((string *)&local_b8,"cge",&local_b9);
          std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
          std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
          std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
          CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
        }
        else {
          bVar2 = std::operator==(&compareNodeSymbol,">");
          pCVar1 = this->writer;
          if (bVar2) {
            std::__cxx11::string::string((string *)&local_b8,"cgt",&local_b9);
            std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
            std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
            std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
            CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
          }
          else {
            std::__cxx11::string::string((string *)&local_b8,"clt",&local_b9);
            std::__cxx11::string::string((string *)&local_98,"r1",&local_ba);
            std::__cxx11::string::string((string *)&local_78,"r1",&local_bb);
            std::__cxx11::string::string((string *)&local_58,"r2",&local_bc);
            CodeWriter::OP(pCVar1,&local_b8,&local_98,&local_78,&local_58);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  pCVar1 = this->writer;
  std::__cxx11::string::string((string *)&local_b8,"r12",(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_98,"r1",(allocator *)&local_58);
  CodeWriter::saveWord(pCVar1,-4,&local_b8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&compareNodeSymbol);
  return;
}

Assistant:

void CGV::visit(CompareOp *node) {
    visitNodesAndUpdateFramePointer(node, false);
    writer->loadWord("r1", -4, "r12");
    writer->loadWord("r2", -12, "r12");

    writer->comment("Comparing");
    auto compareNodeSymbol = node->getChild(1)->getName();
    if (compareNodeSymbol == "==") writer->OP("ceq", "r1", "r1", "r2");
    else if (compareNodeSymbol == "<>") writer->OP("cne", "r1", "r1", "r2");
    else if (compareNodeSymbol == "<=") writer->OP("cle", "r1", "r1", "r2");
    else if (compareNodeSymbol == ">=") writer->OP("cge", "r1", "r1", "r2");
    else if (compareNodeSymbol == ">") writer->OP("cgt", "r1", "r1", "r2");
    else writer->OP("clt", "r1", "r1", "r2");
    writer->saveWord(-4, "r12", "r1");
}